

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  int i;
  long lVar4;
  string cmd;
  ifstream fin;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)&FILEPATH_abi_cxx11_,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_238,0x1091e8);
    std::istream::read((char *)local_238,0x10b1f0);
    std::istream::read((char *)local_238,0x12b1f0);
  }
  else {
    super_block.block_bitmap[0] = true;
    inodes[0].i_mode = 1;
    lVar3 = 0x10b1fc;
    lVar4 = 0;
    do {
      *(int *)(lVar3 + -0xc) = (int)lVar4;
      *(undefined8 *)(lVar3 + -4) = 0;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 != 0x1000);
    emptyspaces[0xfc] = '\0';
    emptyspaces[0xfd] = '\0';
    emptyspaces[0xfe] = '\0';
    emptyspaces[0xff] = '\0';
    super_block.inode_bitmap[0] = true;
    emptyspaces[0] = '.';
    emptyspaces[1] = '\0';
  }
  std::ifstream::close();
  do {
    local_270 = 0;
    local_268[0] = 0;
    local_278 = local_268;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>",2);
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x70);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_278,cVar2);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_258,local_278,local_278 + local_270);
    operation(&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    bVar1 = flag;
    if (local_278 != local_268) {
      operator_delete(local_278);
    }
  } while (bVar1 != false);
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main(){
    ifstream fin(FILEPATH, ios::binary);
    if (fin){
        fin.read((char *)&super_block, sizeof(Super_Block));
        fin.read((char *)inodes, sizeof(inodes));
        fin.read((char *)emptyspaces, sizeof(emptyspaces));
    }
    else{
        initialize();
    }
    fin.close();
    while(1){
        string cmd;
        cout << ">>";
        getline (cin, cmd);
        operation(cmd);
        if(!flag)break;
    }
    return 0;
}